

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_stroke_poly_line
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_draw_list_stroke closed,float thickness,nk_anti_aliasing aliasing)

{
  undefined8 *puVar1;
  nk_vec2 nVar2;
  uint uVar3;
  nk_buffer *b;
  void *pvVar4;
  nk_size nVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  short sVar10;
  short sVar11;
  nk_draw_index nVar12;
  int iVar13;
  void *pvVar14;
  nk_draw_index *pnVar15;
  undefined8 *puVar16;
  ulong uVar17;
  nk_draw_index nVar18;
  uint uVar19;
  ulong uVar20;
  nk_draw_index nVar21;
  float fVar22;
  uint uVar23;
  nk_draw_index nVar24;
  ulong uVar25;
  nk_draw_index nVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  nk_vec2 *pnVar30;
  bool bVar31;
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_vec2 pos_01;
  nk_vec2 pos_02;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_colorf color_03;
  nk_colorf color_04;
  nk_colorf color_05;
  nk_colorf color_06;
  nk_colorf color_07;
  nk_colorf color_08;
  nk_colorf color_09;
  nk_colorf color_10;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x25a0,
                  "void nk_draw_list_stroke_poly_line(struct nk_draw_list *, const struct nk_vec2 *, const unsigned int, struct nk_color, enum nk_draw_list_stroke, float, enum nk_anti_aliasing)"
                 );
  }
  if (points_count < 2) {
    return;
  }
  fVar32 = (list->config).global_alpha;
  uVar29 = (ulong)points_count;
  uVar23 = points_count - 1;
  uVar17 = (ulong)uVar23;
  uVar28 = uVar29;
  if (closed == NK_STROKE_OPEN) {
    uVar28 = uVar17;
  }
  iVar13 = (int)((float)((int)((float)((uint)color >> 0x18) * fVar32) & 0xff) * fVar32);
  fVar32 = (float)((uint)color & 0xff) * 0.003921569;
  fVar34 = (float)((uint)color >> 8 & 0xff) * 0.003921569;
  uVar25 = (ulong)color._2_2_ & 0xffffffffffff00ff;
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar25;
  auVar6[0xc] = (char)((uint)iVar13 >> 0x10);
  auVar7[8] = (char)((uint)iVar13 >> 8);
  auVar7._0_8_ = uVar25;
  auVar7[9] = 0;
  auVar7._10_3_ = auVar6._10_3_;
  auVar9._5_8_ = 0;
  auVar9._0_5_ = auVar7._8_5_;
  auVar8[4] = (char)iVar13;
  auVar8._0_4_ = (int)uVar25;
  auVar8[5] = 0;
  auVar8._6_7_ = SUB137(auVar9 << 0x40,6);
  fVar33 = (float)(int)uVar25 * 0.003921569;
  fVar35 = (float)auVar8._4_4_ * 0.003921569;
  uVar3 = list->vertex_count;
  if (aliasing != NK_ANTI_ALIASING_ON) {
    pvVar14 = nk_draw_list_alloc_vertices(list,uVar28 * 4);
    pnVar15 = nk_draw_list_alloc_elements(list,uVar28 * 6);
    if (pnVar15 == (nk_draw_index *)0x0 || pvVar14 == (void *)0x0) {
      return;
    }
    lVar27 = 0;
    uVar17 = 1;
    do {
      uVar25 = 0;
      if (uVar29 != uVar17) {
        uVar25 = uVar17;
      }
      fVar22 = *(float *)((long)&points->x + lVar27 * 2);
      fVar39 = *(float *)((long)&points->y + lVar27 * 2);
      fVar40 = points[uVar25].x;
      fVar41 = points[uVar25].y;
      fVar36 = fVar40 - fVar22;
      fVar37 = fVar41 - fVar39;
      fVar42 = fVar36 * fVar36 + fVar37 * fVar37;
      fVar38 = 1.0;
      if ((fVar42 != 0.0) || (NAN(fVar42))) {
        fVar38 = (float)(0x5f375a84 - ((uint)fVar42 >> 1));
        fVar38 = (fVar42 * -0.5 * fVar38 * fVar38 + 1.5) * fVar38;
      }
      sVar10 = (short)uVar3;
      sVar11 = (short)lVar27;
      nVar2 = (list->config).null.uv;
      fVar42 = fVar36 * fVar38 * thickness * 0.5;
      fVar38 = fVar37 * fVar38 * thickness * 0.5;
      pos.x = fVar22 + fVar38;
      pos.y = fVar39 - fVar42;
      color_00.g = fVar34;
      color_00.r = fVar32;
      color_00.a = fVar35;
      color_00.b = fVar33;
      pvVar14 = nk_draw_vertex(pvVar14,(nk_convert_config *)(list->config).vertex_layout,pos,nVar2,
                               color_00);
      pos_00.x = fVar40 + fVar38;
      pos_00.y = fVar41 - fVar42;
      color_01.g = fVar34;
      color_01.r = fVar32;
      color_01.a = fVar35;
      color_01.b = fVar33;
      pvVar14 = nk_draw_vertex(pvVar14,(nk_convert_config *)(list->config).vertex_layout,pos_00,
                               nVar2,color_01);
      pos_01.x = fVar40 - fVar38;
      pos_01.y = fVar41 + fVar42;
      color_02.g = fVar34;
      color_02.r = fVar32;
      color_02.a = fVar35;
      color_02.b = fVar33;
      pvVar14 = nk_draw_vertex(pvVar14,(nk_convert_config *)(list->config).vertex_layout,pos_01,
                               nVar2,color_02);
      pos_02.x = fVar22 - fVar38;
      pos_02.y = fVar42 + fVar39;
      color_03.g = fVar34;
      color_03.r = fVar32;
      color_03.a = fVar35;
      color_03.b = fVar33;
      pvVar14 = nk_draw_vertex(pvVar14,(nk_convert_config *)(list->config).vertex_layout,pos_02,
                               nVar2,color_03);
      *pnVar15 = sVar10 + sVar11;
      pnVar15[1] = sVar10 + sVar11 + 1;
      nVar12 = sVar10 + 2 + sVar11;
      pnVar15[2] = nVar12;
      pnVar15[3] = sVar10 + sVar11;
      pnVar15[4] = nVar12;
      pnVar15[5] = sVar10 + sVar11 + 3;
      pnVar15 = pnVar15 + 6;
      lVar27 = lVar27 + 4;
      bVar31 = uVar17 != uVar28;
      uVar17 = uVar17 + 1;
    } while (bVar31);
    return;
  }
  lVar27 = 0xc;
  if (1.0 < thickness) {
    lVar27 = 0x12;
  }
  uVar19 = points_count * 3;
  if (1.0 < thickness) {
    uVar19 = points_count * 4;
  }
  pvVar14 = nk_draw_list_alloc_vertices(list,(ulong)uVar19);
  pnVar15 = nk_draw_list_alloc_elements(list,lVar27 * uVar28);
  if (pvVar14 == (void *)0x0) {
    return;
  }
  if (pnVar15 == (nk_draw_index *)0x0) {
    return;
  }
  b = list->vertices;
  pvVar4 = (b->memory).ptr;
  nVar5 = b->allocated;
  b->marker[0].active = 1;
  b->marker[0].offset = nVar5;
  puVar16 = (undefined8 *)
            nk_buffer_alloc(b,NK_BUFFER_FRONT,((ulong)(1.0 < thickness) * 0x10 + 0x18) * uVar29,4);
  if (puVar16 == (undefined8 *)0x0) {
    return;
  }
  puVar1 = puVar16 + uVar29;
  pvVar14 = (void *)((long)pvVar14 + ((long)(list->vertices->memory).ptr - (long)pvVar4));
  uVar25 = 1;
  do {
    uVar20 = uVar25;
    if (uVar29 == uVar25) {
      uVar20 = 0;
    }
    fVar40 = points[uVar20].x - points[uVar25 - 1].x;
    fVar39 = points[uVar20].y - points[uVar25 - 1].y;
    fVar41 = fVar40 * fVar40 + fVar39 * fVar39;
    fVar22 = 1.0;
    if ((fVar41 != 0.0) || (NAN(fVar41))) {
      fVar22 = (float)(0x5f375a84 - ((uint)fVar41 >> 1));
      fVar22 = (fVar41 * -0.5 * fVar22 * fVar22 + 1.5) * fVar22;
    }
    puVar16[uVar25 - 1] = CONCAT44(fVar22 * -fVar40,fVar22 * fVar39);
    bVar31 = uVar25 != uVar28;
    uVar25 = uVar25 + 1;
  } while (bVar31);
  if (closed == NK_STROKE_OPEN) {
    puVar16[uVar17] = puVar16[points_count - 2];
    if (thickness <= 1.0) {
      fVar22 = (float)*puVar16;
      fVar39 = (float)((ulong)*puVar16 >> 0x20);
      *puVar1 = CONCAT44((*points).y + fVar39,(*points).x + fVar22);
      puVar1[1] = CONCAT44((*points).y - fVar39,(*points).x - fVar22);
      fVar22 = (float)puVar16[uVar17];
      fVar39 = (float)((ulong)puVar16[uVar17] >> 0x20);
      puVar1[uVar23 * 2] = CONCAT44(points[uVar17].y + fVar39,points[uVar17].x + fVar22);
      puVar1[(ulong)(uVar23 * 2) + 1] =
           CONCAT44(points[uVar17].y - fVar39,points[uVar17].x - fVar22);
      goto LAB_0010ad02;
    }
    fVar42 = (thickness + -1.0) * 0.5;
    fVar22 = fVar42 + 1.0;
    fVar39 = (float)*puVar16;
    fVar41 = fVar22 * fVar39;
    fVar40 = (float)((ulong)*puVar16 >> 0x20);
    fVar38 = fVar22 * fVar40;
    *puVar1 = CONCAT44((*points).y + fVar38,(*points).x + fVar41);
    fVar39 = fVar39 * fVar42;
    fVar40 = fVar40 * fVar42;
    puVar1[1] = CONCAT44((*points).y + fVar40,(*points).x + fVar39);
    puVar1[2] = CONCAT44((*points).y - fVar40,(*points).x - fVar39);
    puVar1[3] = CONCAT44((*points).y - fVar38,(*points).x - fVar41);
    uVar25 = (ulong)(uVar23 * 4);
    fVar40 = (float)puVar16[uVar17];
    fVar39 = fVar22 * fVar40;
    fVar41 = (float)((ulong)puVar16[uVar17] >> 0x20);
    fVar22 = fVar22 * fVar41;
    puVar1[uVar25] = CONCAT44(points[uVar17].y + fVar22,points[uVar17].x + fVar39);
    fVar40 = fVar42 * fVar40;
    fVar41 = fVar42 * fVar41;
    puVar1[uVar25 + 1] = CONCAT44(points[uVar17].y + fVar41,points[uVar17].x + fVar40);
    puVar1[uVar25 + 2] = CONCAT44(points[uVar17].y - fVar41,points[uVar17].x - fVar40);
    puVar1[uVar25 + 3] = CONCAT44(points[uVar17].y - fVar22,points[uVar17].x - fVar39);
  }
  else {
    if (thickness <= 1.0) {
LAB_0010ad02:
      uVar17 = 1;
      uVar23 = uVar3;
      do {
        uVar25 = uVar17;
        uVar19 = uVar23 + 3;
        if (uVar29 == uVar17) {
          uVar25 = 0;
          uVar19 = uVar3;
        }
        fVar22 = ((float)puVar16[uVar25] + (float)puVar16[uVar17 - 1]) * 0.5;
        fVar39 = ((float)((ulong)puVar16[uVar25] >> 0x20) +
                 (float)((ulong)puVar16[uVar17 - 1] >> 0x20)) * 0.5;
        fVar40 = fVar22 * fVar22 + fVar39 * fVar39;
        if (1e-06 < fVar40) {
          fVar40 = 1.0 / fVar40;
          fVar41 = 100.0;
          if (fVar40 <= 100.0) {
            fVar41 = fVar40;
          }
          fVar22 = fVar22 * fVar41;
          fVar39 = fVar39 * fVar41;
        }
        puVar1[uVar25 * 2] = CONCAT44(points[uVar25].y + fVar39,points[uVar25].x + fVar22);
        puVar1[uVar25 * 2 + 1] = CONCAT44(points[uVar25].y - fVar39,points[uVar25].x - fVar22);
        nVar12 = (nk_draw_index)uVar19;
        *pnVar15 = nVar12;
        nVar21 = (nk_draw_index)uVar23;
        pnVar15[1] = nVar21;
        pnVar15[2] = nVar21 + 2;
        pnVar15[3] = nVar21 + 2;
        pnVar15[4] = nVar12 + 2;
        pnVar15[5] = nVar12;
        pnVar15[6] = nVar12 + 1;
        pnVar15[7] = nVar21 + 1;
        pnVar15[8] = nVar21;
        pnVar15[9] = nVar21;
        pnVar15[10] = nVar12;
        pnVar15[0xb] = nVar12 + 1;
        pnVar15 = pnVar15 + 0xc;
        bVar31 = uVar17 != uVar28;
        uVar17 = uVar17 + 1;
        uVar23 = uVar19;
      } while (bVar31);
      pnVar30 = (nk_vec2 *)(puVar16 + uVar29 + 1);
      uVar28 = 0;
      do {
        nVar2 = (list->config).null.uv;
        color_08.g = fVar34;
        color_08.r = fVar32;
        color_08.a = fVar35;
        color_08.b = fVar33;
        pvVar14 = nk_draw_vertex(pvVar14,(nk_convert_config *)(list->config).vertex_layout,
                                 points[uVar28],nVar2,color_08);
        color_09.g = fVar34;
        color_09.r = fVar32;
        color_09.b = fVar33;
        color_09.a = 0.0;
        pvVar14 = nk_draw_vertex(pvVar14,(nk_convert_config *)(list->config).vertex_layout,
                                 pnVar30[-1],nVar2,color_09);
        color_10.g = fVar34;
        color_10.r = fVar32;
        color_10.b = fVar33;
        color_10.a = 0.0;
        pvVar14 = nk_draw_vertex(pvVar14,(nk_convert_config *)(list->config).vertex_layout,*pnVar30,
                                 nVar2,color_10);
        uVar28 = uVar28 + 1;
        pnVar30 = pnVar30 + 2;
      } while (uVar29 != uVar28);
      goto LAB_0010aec2;
    }
    fVar42 = (thickness + -1.0) * 0.5;
  }
  uVar17 = 1;
  uVar23 = uVar3;
  do {
    uVar25 = uVar17;
    uVar19 = uVar23 + 4;
    if (uVar29 == uVar17) {
      uVar25 = 0;
      uVar19 = uVar3;
    }
    fVar22 = ((float)puVar16[uVar25] + (float)puVar16[uVar17 - 1]) * 0.5;
    fVar39 = ((float)((ulong)puVar16[uVar25] >> 0x20) + (float)((ulong)puVar16[uVar17 - 1] >> 0x20))
             * 0.5;
    fVar40 = fVar22 * fVar22 + fVar39 * fVar39;
    if (1e-06 < fVar40) {
      fVar40 = 1.0 / fVar40;
      fVar41 = 100.0;
      if (fVar40 <= 100.0) {
        fVar41 = fVar40;
      }
      fVar22 = fVar22 * fVar41;
      fVar39 = fVar39 * fVar41;
    }
    fVar40 = (fVar42 + 1.0) * fVar22;
    fVar41 = (fVar42 + 1.0) * fVar39;
    puVar1[uVar25 * 4] = CONCAT44(points[uVar25].y + fVar41,points[uVar25].x + fVar40);
    puVar1[uVar25 * 4 + 1] =
         CONCAT44(points[uVar25].y + fVar39 * fVar42,points[uVar25].x + fVar22 * fVar42);
    puVar1[uVar25 * 4 + 2] =
         CONCAT44(points[uVar25].y - fVar39 * fVar42,points[uVar25].x - fVar22 * fVar42);
    puVar1[uVar25 * 4 + 3] = CONCAT44(points[uVar25].y - fVar41,points[uVar25].x - fVar40);
    nVar12 = (nk_draw_index)uVar19;
    nVar24 = nVar12 + 1;
    *pnVar15 = nVar24;
    nVar21 = (nk_draw_index)uVar23;
    pnVar15[1] = nVar21 + 1;
    nVar26 = nVar21 + 2;
    pnVar15[2] = nVar26;
    pnVar15[3] = nVar26;
    nVar18 = nVar12 + 2;
    pnVar15[4] = nVar18;
    pnVar15[5] = nVar24;
    pnVar15[6] = nVar24;
    pnVar15[7] = nVar21 + 1;
    pnVar15[8] = nVar21;
    pnVar15[9] = nVar21;
    pnVar15[10] = nVar12;
    pnVar15[0xb] = nVar24;
    pnVar15[0xc] = nVar18;
    pnVar15[0xd] = nVar26;
    pnVar15[0xe] = nVar21 + 3;
    pnVar15[0xf] = nVar21 + 3;
    pnVar15[0x10] = nVar12 + 3;
    pnVar15[0x11] = nVar18;
    pnVar15 = pnVar15 + 0x12;
    bVar31 = uVar17 != uVar28;
    uVar17 = uVar17 + 1;
    uVar23 = uVar19;
  } while (bVar31);
  pnVar30 = (nk_vec2 *)(puVar16 + uVar29 + 3);
  do {
    nVar2 = (list->config).null.uv;
    color_04.g = fVar34;
    color_04.r = fVar32;
    color_04.b = fVar33;
    color_04.a = 0.0;
    pvVar14 = nk_draw_vertex(pvVar14,(nk_convert_config *)(list->config).vertex_layout,pnVar30[-3],
                             nVar2,color_04);
    color_05.g = fVar34;
    color_05.r = fVar32;
    color_05.a = fVar35;
    color_05.b = fVar33;
    pvVar14 = nk_draw_vertex(pvVar14,(nk_convert_config *)(list->config).vertex_layout,pnVar30[-2],
                             nVar2,color_05);
    color_06.g = fVar34;
    color_06.r = fVar32;
    color_06.a = fVar35;
    color_06.b = fVar33;
    pvVar14 = nk_draw_vertex(pvVar14,(nk_convert_config *)(list->config).vertex_layout,pnVar30[-1],
                             nVar2,color_06);
    color_07.g = fVar34;
    color_07.r = fVar32;
    color_07.b = fVar33;
    color_07.a = 0.0;
    pvVar14 = nk_draw_vertex(pvVar14,(nk_convert_config *)(list->config).vertex_layout,*pnVar30,
                             nVar2,color_07);
    pnVar30 = pnVar30 + 4;
    uVar29 = uVar29 - 1;
  } while (uVar29 != 0);
LAB_0010aec2:
  nk_buffer_reset(list->vertices,NK_BUFFER_FRONT);
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_poly_line(struct nk_draw_list *list, const struct nk_vec2 *points,
    const unsigned int points_count, struct nk_color color, enum nk_draw_list_stroke closed,
    float thickness, enum nk_anti_aliasing aliasing)
{
    nk_size count;
    int thick_line;
    struct nk_colorf col;
    struct nk_colorf col_trans;
    NK_ASSERT(list);
    if (!list || points_count < 2) return;

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    count = points_count;
    if (!closed) count = points_count-1;
    thick_line = thickness > 1.0f;

#ifdef NK_INCLUDE_COMMAND_USERDATA
    nk_draw_list_push_userdata(list, list->userdata);
#endif

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    nk_color_fv(&col.r, color);
    col_trans = col;
    col_trans.a = 0;

    if (aliasing == NK_ANTI_ALIASING_ON) {
        /* ANTI-ALIASED STROKE */
        const float AA_SIZE = 1.0f;
        NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
        NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);

        /* allocate vertices and elements  */
        nk_size i1 = 0;
        nk_size vertex_offset;
        nk_size index = list->vertex_count;

        const nk_size idx_count = (thick_line) ?  (count * 18) : (count * 12);
        const nk_size vtx_count = (thick_line) ? (points_count * 4): (points_count *3);

        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        nk_size size;
        struct nk_vec2 *normals, *temp;
        if (!vtx || !ids) return;

        /* temporary allocate normals + points */
        vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
        nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
        size = pnt_size * ((thick_line) ? 5 : 3) * points_count;
        normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
        if (!normals) return;
        temp = normals + points_count;

        /* make sure vertex pointer is still correct */
        vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

        /* calculate normals */
        for (i1 = 0; i1 < count; ++i1) {
            const nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
            struct nk_vec2 diff = nk_vec2_sub(points[i2], points[i1]);
            float len;

            /* vec2 inverted length  */
            len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;

            diff = nk_vec2_muls(diff, len);
            normals[i1].x = diff.y;
            normals[i1].y = -diff.x;
        }

        if (!closed)
            normals[points_count-1] = normals[points_count-2];

        if (!thick_line) {
            nk_size idx1, i;
            if (!closed) {
                struct nk_vec2 d;
                temp[0] = nk_vec2_add(points[0], nk_vec2_muls(normals[0], AA_SIZE));
                temp[1] = nk_vec2_sub(points[0], nk_vec2_muls(normals[0], AA_SIZE));
                d = nk_vec2_muls(normals[points_count-1], AA_SIZE);
                temp[(points_count-1) * 2 + 0] = nk_vec2_add(points[points_count-1], d);
                temp[(points_count-1) * 2 + 1] = nk_vec2_sub(points[points_count-1], d);
            }

            /* fill elements */
            idx1 = index;
            for (i1 = 0; i1 < count; i1++) {
                struct nk_vec2 dm;
                float dmr2;
                nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
                nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 3);

                /* average normals */
                dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
                dmr2 = dm.x * dm.x + dm.y* dm.y;
                if (dmr2 > 0.000001f) {
                    float scale = 1.0f/dmr2;
                    scale = NK_MIN(100.0f, scale);
                    dm = nk_vec2_muls(dm, scale);
                }

                dm = nk_vec2_muls(dm, AA_SIZE);
                temp[i2*2+0] = nk_vec2_add(points[i2], dm);
                temp[i2*2+1] = nk_vec2_sub(points[i2], dm);

                ids[0] = (nk_draw_index)(idx2 + 0); ids[1] = (nk_draw_index)(idx1+0);
                ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
                ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+0);
                ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
                ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
                ids[10]= (nk_draw_index)(idx2 + 0); ids[11]= (nk_draw_index)(idx2+1);
                ids += 12;
                idx1 = idx2;
            }

            /* fill vertices */
            for (i = 0; i < points_count; ++i) {
                const struct nk_vec2 uv = list->config.null.uv;
                vtx = nk_draw_vertex(vtx, &list->config, points[i], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+0], uv, col_trans);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+1], uv, col_trans);
            }
        } else {
            nk_size idx1, i;
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed) {
                struct nk_vec2 d1 = nk_vec2_muls(normals[0], half_inner_thickness + AA_SIZE);
                struct nk_vec2 d2 = nk_vec2_muls(normals[0], half_inner_thickness);

                temp[0] = nk_vec2_add(points[0], d1);
                temp[1] = nk_vec2_add(points[0], d2);
                temp[2] = nk_vec2_sub(points[0], d2);
                temp[3] = nk_vec2_sub(points[0], d1);

                d1 = nk_vec2_muls(normals[points_count-1], half_inner_thickness + AA_SIZE);
                d2 = nk_vec2_muls(normals[points_count-1], half_inner_thickness);

                temp[(points_count-1)*4+0] = nk_vec2_add(points[points_count-1], d1);
                temp[(points_count-1)*4+1] = nk_vec2_add(points[points_count-1], d2);
                temp[(points_count-1)*4+2] = nk_vec2_sub(points[points_count-1], d2);
                temp[(points_count-1)*4+3] = nk_vec2_sub(points[points_count-1], d1);
            }

            /* add all elements */
            idx1 = index;
            for (i1 = 0; i1 < count; ++i1) {
                struct nk_vec2 dm_out, dm_in;
                const nk_size i2 = ((i1+1) == points_count) ? 0: (i1 + 1);
                nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 4);

                /* average normals */
                struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
                float dmr2 = dm.x * dm.x + dm.y* dm.y;
                if (dmr2 > 0.000001f) {
                    float scale = 1.0f/dmr2;
                    scale = NK_MIN(100.0f, scale);
                    dm = nk_vec2_muls(dm, scale);
                }

                dm_out = nk_vec2_muls(dm, ((half_inner_thickness) + AA_SIZE));
                dm_in = nk_vec2_muls(dm, half_inner_thickness);
                temp[i2*4+0] = nk_vec2_add(points[i2], dm_out);
                temp[i2*4+1] = nk_vec2_add(points[i2], dm_in);
                temp[i2*4+2] = nk_vec2_sub(points[i2], dm_in);
                temp[i2*4+3] = nk_vec2_sub(points[i2], dm_out);

                /* add indexes */
                ids[0] = (nk_draw_index)(idx2 + 1); ids[1] = (nk_draw_index)(idx1+1);
                ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
                ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+1);
                ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
                ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
                ids[10]= (nk_draw_index)(idx2 + 0); ids[11] = (nk_draw_index)(idx2+1);
                ids[12]= (nk_draw_index)(idx2 + 2); ids[13] = (nk_draw_index)(idx1+2);
                ids[14]= (nk_draw_index)(idx1 + 3); ids[15] = (nk_draw_index)(idx1+3);
                ids[16]= (nk_draw_index)(idx2 + 3); ids[17] = (nk_draw_index)(idx2+2);
                ids += 18;
                idx1 = idx2;
            }

            /* add vertices */
            for (i = 0; i < points_count; ++i) {
                const struct nk_vec2 uv = list->config.null.uv;
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+0], uv, col_trans);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+1], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+2], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+3], uv, col_trans);
            }
        }
        /* free temporary normals + points */
        nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
    } else {
        /* NON ANTI-ALIASED STROKE */
        nk_size i1 = 0;
        nk_size idx = list->vertex_count;
        const nk_size idx_count = count * 6;
        const nk_size vtx_count = count * 4;
        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);
        if (!vtx || !ids) return;

        for (i1 = 0; i1 < count; ++i1) {
            float dx, dy;
            const struct nk_vec2 uv = list->config.null.uv;
            const nk_size i2 = ((i1+1) == points_count) ? 0 : i1 + 1;
            const struct nk_vec2 p1 = points[i1];
            const struct nk_vec2 p2 = points[i2];
            struct nk_vec2 diff = nk_vec2_sub(p2, p1);
            float len;

            /* vec2 inverted length  */
            len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;
            diff = nk_vec2_muls(diff, len);

            /* add vertices */
            dx = diff.x * (thickness * 0.5f);
            dy = diff.y * (thickness * 0.5f);

            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x + dy, p1.y - dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x + dy, p2.y - dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x - dy, p2.y + dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x - dy, p1.y + dx), uv, col);

            ids[0] = (nk_draw_index)(idx+0); ids[1] = (nk_draw_index)(idx+1);
            ids[2] = (nk_draw_index)(idx+2); ids[3] = (nk_draw_index)(idx+0);
            ids[4] = (nk_draw_index)(idx+2); ids[5] = (nk_draw_index)(idx+3);

            ids += 6;
            idx += 4;
        }
    }
}